

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZQuadSphere.h
# Opt level: O0

TPZFMatrix<Fad<double>_> *
pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>::TensorProd<Fad<double>>
          (TPZFMatrix<Fad<double>_> *vec1,TPZFMatrix<Fad<double>_> *vec2)

{
  Fad<double> *this;
  TPZFMatrix<Fad<double>_> *in_RDI;
  int j;
  int i;
  TPZFNMatrix<9,_Fad<double>_> res;
  Fad<double> *in_stack_fffffffffffffda0;
  double *in_stack_fffffffffffffda8;
  TPZFMatrix<Fad<double>_> *A;
  TPZFMatrix<Fad<double>_> *this_00;
  Fad<double> *in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd8;
  int iVar1;
  int local_220;
  Fad<double> *in_stack_fffffffffffffe18;
  Fad<double> *in_stack_fffffffffffffe20;
  int64_t in_stack_fffffffffffffe28;
  TPZFNMatrix<9,_Fad<double>_> *in_stack_fffffffffffffe30;
  
  this_00 = (TPZFMatrix<Fad<double>_> *)&stack0xfffffffffffffdf8;
  A = in_RDI;
  Fad<double>::Fad<double,_nullptr>((Fad<double> *)in_RDI,in_stack_fffffffffffffda8);
  TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,(int64_t)in_stack_fffffffffffffe20,
             in_stack_fffffffffffffe18);
  Fad<double>::~Fad(in_stack_fffffffffffffda0);
  for (local_220 = 0; local_220 < 3; local_220 = local_220 + 1) {
    for (iVar1 = 0; iVar1 < 3; iVar1 = iVar1 + 1) {
      TPZFMatrix<Fad<double>_>::operator()(this_00,(int64_t)A,(int64_t)in_RDI);
      this = TPZFMatrix<Fad<double>_>::operator()(this_00,(int64_t)A,(int64_t)in_RDI);
      operator*<Fad<double>,_Fad<double>,_nullptr>
                ((Fad<double> *)CONCAT44(iVar1,in_stack_fffffffffffffdd8),in_stack_fffffffffffffdd0)
      ;
      TPZFMatrix<Fad<double>_>::operator()(this_00,(int64_t)A,(int64_t)in_RDI);
      Fad<double>::operator=
                ((Fad<double> *)this_00,(FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)A);
      FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)this);
    }
  }
  TPZFMatrix<Fad<double>_>::TPZFMatrix(this_00,A);
  TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<9,_Fad<double>_> *)0x17c9e23);
  return A;
}

Assistant:

static TPZFMatrix<T> TensorProd(TPZFMatrix<T> &vec1, TPZFMatrix<T> &vec2)
        {
            TPZFNMatrix<9,T> res(3,3,0.);
            for (int i = 0; i < 3; i++) {
                for (int j = 0; j < 3; j++) {
                    res(i,j) = vec1(i,0) * vec2(j,0);
                }
            }
            return res;
        }